

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

value_type __thiscall
jsoncons::jsonpath::detail::
avg_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (avg_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  iterator this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  size_t sVar5;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  double dVar7;
  undefined1 auVar8 [16];
  array_range_type aVar9;
  value_type vVar10;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  double local_48;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_40;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != 0) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar4);
    uVar6 = extraout_RDX;
    goto LAB_003beaeb;
  }
  if (*pcVar1 == '\0') {
    pbVar4 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8);
  }
  else {
    pbVar4 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
  }
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (&local_40,pbVar4);
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(&local_40);
  if (bVar2) {
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(&local_40);
    if (bVar2) goto LAB_003bead1;
    aVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(&local_40)
    ;
    this_00 = aVar9.first_._M_current;
    bVar2 = this_00._M_current == aVar9.last_._M_current._M_current;
    if (bVar2) {
      local_48 = 0.0;
    }
    else {
      local_48 = 0.0;
      do {
        bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                          (this_00._M_current);
        if (!bVar3) {
          std::error_code::operator=(in_RCX,invalid_type);
          pbVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar4
                    );
          break;
        }
        dVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                          (this_00._M_current);
        local_48 = local_48 + dVar7;
        this_00._M_current = this_00._M_current + 1;
        bVar2 = this_00._M_current == aVar9.last_._M_current._M_current;
      } while (!bVar2);
    }
    if (bVar2) {
      sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(&local_40);
      auVar8._8_4_ = (int)(sVar5 >> 0x20);
      auVar8._0_8_ = sVar5;
      auVar8._12_4_ = 0x45300000;
      *(undefined2 *)
       &(this->
        super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        )._vptr_function_base = 5;
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)
           (local_48 /
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
    }
  }
  else {
    std::error_code::operator=(in_RCX,invalid_type);
LAB_003bead1:
    pbVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar4);
  }
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_40);
  uVar6 = extraout_RDX_00;
LAB_003beaeb:
  vVar10.field_0.int64_.val_ = uVar6;
  vVar10.field_0._0_8_ = this;
  return (value_type)vVar10.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            if (arg0.empty())
            {
                return value_type::null();
            }
            double sum = 0;
            for (auto& j : arg0.array_range())
            {
                if (!j.is_number())
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                sum += j.template as<double>();
            }

            return value_type(sum / static_cast<double>(arg0.size()), semantic_tag::none);
        }